

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O2

void __thiscall
cmComputeLinkInformation::cmComputeLinkInformation
          (cmComputeLinkInformation *this,cmGeneratorTarget *target,string *config)

{
  _Rb_tree_header *p_Var1;
  string *__rhs;
  unique_ptr<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_> *this_00;
  cmGlobalGenerator **__args_1;
  pointer pcVar2;
  cmGlobalGenerator *pcVar3;
  cmGeneratorTarget *this_01;
  cmOrderDirectories *this_02;
  _Alloc_hider _Var4;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *implicitDirs;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
  *this_03;
  bool bVar5;
  TargetType TVar6;
  PolicyStatus PVar7;
  cmMakefile *pcVar8;
  cmLocalGenerator *pcVar9;
  cmState *this_04;
  cmValue cVar10;
  string *psVar11;
  pointer pbVar12;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  directories;
  string loader_flag_var;
  string rtSepVar;
  string rlVar;
  undefined1 local_348 [56];
  unique_ptr<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_> *local_310;
  unique_ptr<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_> *local_308;
  FeatureDescriptor local_300;
  string *local_258;
  string *local_250;
  string *local_248;
  string *local_240;
  cmGeneratorTarget *local_238;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_230;
  string *local_228;
  string *local_220;
  string *local_218;
  string *local_210;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_208;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_200;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
  *local_1f8;
  cmAlphaNum local_1f0 [2];
  RegularExpression *local_180;
  RegularExpression *local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  p_Var1 = &(this->SharedLibrariesLinked)._M_t._M_impl.super__Rb_tree_header;
  (this->SharedLibrariesLinked)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->SharedLibrariesLinked)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->Items).
  super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Items).
  super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Items).
  super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Directories).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Directories).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Directories).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Depends).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Depends).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Depends).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->FrameworkPaths).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->RuntimeSearchPath).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->FrameworkPaths).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->FrameworkPaths).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->RuntimeSearchPath).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->RuntimeSearchPath).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->SharedLibrariesLinked)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->SharedLibrariesLinked)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->SharedLibrariesLinked)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->RuntimeDLLs).
  super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->RuntimeDLLs).
  super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->RuntimeDLLs).
  super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->Target = target;
  local_238 = target;
  pcVar8 = cmTarget::GetMakefile(target->Target);
  this->Makefile = pcVar8;
  pcVar9 = cmGeneratorTarget::GetLocalGenerator(target);
  pcVar3 = pcVar9->GlobalGenerator;
  this->GlobalGenerator = pcVar3;
  this->CMakeInstance = pcVar3->CMakeInstance;
  std::__cxx11::string::string((string *)&this->Config,(string *)config);
  (this->LinkLanguage)._M_dataplus._M_p = (pointer)&(this->LinkLanguage).field_2;
  (this->LinkLanguage)._M_string_length = 0;
  (this->LinkLanguage).field_2._M_local_buf[0] = '\0';
  (this->LoaderFlag).Value = (string *)0x0;
  (this->LibLinkFlag)._M_dataplus._M_p = (pointer)&(this->LibLinkFlag).field_2;
  (this->LibLinkFlag)._M_string_length = 0;
  (this->LibLinkFlag).field_2._M_local_buf[0] = '\0';
  (this->LibLinkFileFlag)._M_dataplus._M_p = (pointer)&(this->LibLinkFileFlag).field_2;
  (this->LibLinkFileFlag)._M_string_length = 0;
  (this->LibLinkFileFlag).field_2._M_local_buf[0] = '\0';
  (this->ObjLinkFileFlag)._M_dataplus._M_p = (pointer)&(this->ObjLinkFileFlag).field_2;
  (this->ObjLinkFileFlag)._M_string_length = 0;
  (this->ObjLinkFileFlag).field_2._M_local_buf[0] = '\0';
  (this->LibLinkSuffix)._M_dataplus._M_p = (pointer)&(this->LibLinkSuffix).field_2;
  (this->LibLinkSuffix)._M_string_length = 0;
  (this->LibLinkSuffix).field_2._M_local_buf[0] = '\0';
  (this->RuntimeFlag)._M_dataplus._M_p = (pointer)&(this->RuntimeFlag).field_2;
  (this->RuntimeFlag)._M_string_length = 0;
  (this->RuntimeFlag).field_2._M_local_buf[0] = '\0';
  (this->RuntimeSep)._M_dataplus._M_p = (pointer)&(this->RuntimeSep).field_2;
  (this->RuntimeSep)._M_string_length = 0;
  __rhs = &this->LinkLanguage;
  (this->RuntimeSep).field_2._M_local_buf[0] = '\0';
  (this->RuntimeAlways)._M_dataplus._M_p = (pointer)&(this->RuntimeAlways).field_2;
  (this->RuntimeAlways)._M_string_length = 0;
  local_240 = (string *)&this->LibLinkFlag;
  local_248 = (string *)&this->LibLinkFileFlag;
  (this->RuntimeAlways).field_2._M_local_buf[0] = '\0';
  (this->RPathLinkFlag)._M_dataplus._M_p = (pointer)&(this->RPathLinkFlag).field_2;
  (this->RPathLinkFlag)._M_string_length = 0;
  local_258 = (string *)&this->ObjLinkFileFlag;
  local_250 = (string *)&this->LibLinkSuffix;
  (this->RPathLinkFlag).field_2._M_local_buf[0] = '\0';
  (this->StaticLinkTypeFlag)._M_dataplus._M_p = (pointer)&(this->StaticLinkTypeFlag).field_2;
  (this->StaticLinkTypeFlag)._M_string_length = 0;
  local_210 = (string *)&this->RuntimeFlag;
  (this->StaticLinkTypeFlag).field_2._M_local_buf[0] = '\0';
  (this->SharedLinkTypeFlag)._M_dataplus._M_p = (pointer)&(this->SharedLinkTypeFlag).field_2;
  (this->SharedLinkTypeFlag)._M_string_length = 0;
  (this->SharedLinkTypeFlag).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->LinkPrefixes)._M_t._M_impl.super__Rb_tree_header;
  (this->LinkPrefixes)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->LinkPrefixes)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->LinkExtensions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->LinkExtensions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->SharedLinkExtensions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->SharedLinkExtensions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->StaticLinkExtensions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->SharedLinkExtensions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->StaticLinkExtensions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->StaticLinkExtensions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->LinkExtensions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->LinkPrefixes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->LinkPrefixes)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->ExtractStaticLibraryName).regmust = (char *)0x0;
  local_218 = (string *)&this->RuntimeSep;
  (this->ExtractStaticLibraryName).program = (char *)0x0;
  local_220 = (string *)&this->RuntimeAlways;
  (this->ExtractStaticLibraryName).progsize = 0;
  local_228 = (string *)&this->RPathLinkFlag;
  (this->ExtractSharedLibraryName).regmust = (char *)0x0;
  (this->ExtractSharedLibraryName).program = (char *)0x0;
  local_178 = &this->ExtractSharedLibraryName;
  (this->ExtractSharedLibraryName).progsize = 0;
  memset(local_178,0,0xaa);
  (this->ExtractAnyLibraryName).regmust = (char *)0x0;
  (this->ExtractAnyLibraryName).program = (char *)0x0;
  local_180 = &this->ExtractAnyLibraryName;
  (this->ExtractAnyLibraryName).progsize = 0;
  memset(local_180,0,0xaa);
  memset(&(this->LinkPrefixes)._M_t._M_impl.super__Rb_tree_header._M_node_count,0,0xb2);
  (this->SharedRegexString)._M_dataplus._M_p = (pointer)&(this->SharedRegexString).field_2;
  (this->SharedRegexString)._M_string_length = 0;
  (this->SharedRegexString).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->FrameworkPathsEmitted)._M_t._M_impl.super__Rb_tree_header;
  (this->FrameworkPathsEmitted)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->FrameworkPathsEmitted)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->FrameworkPathsEmitted)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->FrameworkPathsEmitted)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->ImplicitLinkDirs)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ImplicitLinkDirs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->ImplicitLinkDirs)._M_t._M_impl.super__Rb_tree_header;
  (this->FrameworkPathsEmitted)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->OrderLinkerSearchPath)._M_t.
  super___uniq_ptr_impl<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_>._M_t.
  super__Tuple_impl<0UL,_cmOrderDirectories_*,_std::default_delete<cmOrderDirectories>_>.
  super__Head_base<0UL,_cmOrderDirectories_*,_false>._M_head_impl = (cmOrderDirectories *)0x0;
  (this->ImplicitLinkDirs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->ImplicitLinkDirs)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->ImplicitLinkDirs)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->ImplicitLinkLibs)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  this_00 = &this->OrderLinkerSearchPath;
  (this->ImplicitLinkLibs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_200 = &this->ImplicitLinkDirs;
  p_Var1 = &(this->ImplicitLinkLibs)._M_t._M_impl.super__Rb_tree_header;
  (this->ImplicitLinkLibs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->ImplicitLinkLibs)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  local_208 = &this->RuntimeLinkDirs;
  (this->OldLinkDirMask)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_230 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
               *)&this->OldLinkDirMask;
  (this->OldLinkDirMask)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->OldLinkDirMask)._M_t._M_impl.super__Rb_tree_header;
  (this->RuntimeLinkDirs).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->RuntimeLinkDirs).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ImplicitLinkLibs)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->RuntimeLinkDirs).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->OldLinkDirMask)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->OldLinkDirMask)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->CMP0060WarnItems)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  p_Var1 = &(this->CMP0060WarnItems)._M_t._M_impl.super__Rb_tree_header;
  (this->CMP0060WarnItems)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->OldLinkDirMask)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->OldLinkDirItems).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->OldUserFlagItems).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->OldLinkDirItems).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->OldLinkDirItems).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->OldUserFlagItems).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->OldUserFlagItems).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->CMP0060WarnItems)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->CMP0060WarnItems)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  p_Var1 = &(this->LibraryFeatureDescriptors)._M_t._M_impl.super__Rb_tree_header;
  (this->LibraryFeatureDescriptors)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->LibraryFeatureDescriptors)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->CMP0060WarnItems)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->OrderDependentRPath)._M_t.
  super___uniq_ptr_impl<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_>._M_t.
  super__Tuple_impl<0UL,_cmOrderDirectories_*,_std::default_delete<cmOrderDirectories>_>.
  super__Head_base<0UL,_cmOrderDirectories_*,_false>._M_head_impl = (cmOrderDirectories *)0x0;
  (this->OrderRuntimeSearchPath)._M_t.
  super___uniq_ptr_impl<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_>._M_t.
  super__Tuple_impl<0UL,_cmOrderDirectories_*,_std::default_delete<cmOrderDirectories>_>.
  super__Head_base<0UL,_cmOrderDirectories_*,_false>._M_head_impl = (cmOrderDirectories *)0x0;
  (this->LibraryFeatureDescriptors)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->LibraryFeatureDescriptors)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->LibraryFeatureDescriptors)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_310 = &this->OrderDependentRPath;
  (this->GroupFeatureDescriptors)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_308 = &this->OrderRuntimeSearchPath;
  (this->GroupFeatureDescriptors)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_1f8 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
               *)&this->LibraryFeatureDescriptors;
  p_Var1 = &(this->GroupFeatureDescriptors)._M_t._M_impl.super__Rb_tree_header;
  (this->GroupFeatureDescriptors)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->GroupFeatureDescriptors)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->GroupFeatureDescriptors)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this_04 = cmMakefile::GetState(this->Makefile);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_300,"FIND_LIBRARY_USE_OPENBSD_VERSIONING",(allocator<char> *)local_348
            );
  bVar5 = cmState::GetGlobalPropertyAsBool(this_04,&local_300.Name);
  __args_1 = &this->GlobalGenerator;
  this->OpenBSD = bVar5;
  std::__cxx11::string::~string((string *)&local_300);
  std::
  make_unique<cmOrderDirectories,cmGlobalGenerator*const&,cmGeneratorTarget_const*&,char_const(&)[19]>
            ((cmGlobalGenerator **)&local_300,(cmGeneratorTarget **)__args_1,
             (char (*) [19])&local_238);
  _Var4._M_p = local_300.Name._M_dataplus._M_p;
  local_300.Name._M_dataplus._M_p = (pointer)0x0;
  std::__uniq_ptr_impl<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_>::reset
            ((__uniq_ptr_impl<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_> *)
             this_00,(pointer)_Var4._M_p);
  std::unique_ptr<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_>::~unique_ptr
            ((unique_ptr<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_> *)&local_300)
  ;
  std::
  make_unique<cmOrderDirectories,cmGlobalGenerator*const&,cmGeneratorTarget_const*&,char_const(&)[20]>
            ((cmGlobalGenerator **)&local_300,(cmGeneratorTarget **)__args_1,
             (char (*) [20])&local_238);
  _Var4._M_p = local_300.Name._M_dataplus._M_p;
  local_300.Name._M_dataplus._M_p = (pointer)0x0;
  std::__uniq_ptr_impl<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_>::reset
            ((__uniq_ptr_impl<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_> *)
             local_308,(pointer)_Var4._M_p);
  std::unique_ptr<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_>::~unique_ptr
            ((unique_ptr<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_> *)&local_300)
  ;
  cmGeneratorTarget::GetLinkerLanguage(&local_300.Name,this->Target,config);
  std::__cxx11::string::operator=((string *)__rhs,(string *)&local_300);
  std::__cxx11::string::~string((string *)&local_300);
  if ((this->LinkLanguage)._M_string_length != 0) {
    this_01 = this->Target;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_300,"LINK_DEPENDS_NO_SHARED",(allocator<char> *)local_348);
    bVar5 = cmGeneratorTarget::GetPropertyAsBool(this_01,&local_300.Name);
    this->LinkDependsNoShared = bVar5;
    std::__cxx11::string::~string((string *)&local_300);
    bVar5 = cmGeneratorTarget::IsDLLPlatform(this->Target);
    if (!bVar5) {
      TVar6 = cmGeneratorTarget::GetType(this->Target);
      if (TVar6 == MODULE_LIBRARY) {
        local_300.Name._M_dataplus._M_p = &DAT_0000001b;
        local_300.Name._M_string_length = 0x5bf356;
        local_348._8_8_ = (this->LinkLanguage)._M_dataplus._M_p;
        local_348._0_8_ = (this->LinkLanguage)._M_string_length;
        cmStrCat<char[6]>((string *)local_1f0,(cmAlphaNum *)&local_300,(cmAlphaNum *)local_348,
                          (char (*) [6])0x5b1ac1);
        cVar10 = cmMakefile::GetDefinition(this->Makefile,(string *)local_1f0);
        (this->LoaderFlag).Value = cVar10.Value;
        std::__cxx11::string::~string((string *)local_1f0);
      }
    }
    pcVar8 = this->Makefile;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348,
                   "CMAKE_",__rhs);
    std::operator+(&local_300.Name,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348,
                   "_LINK_LIBRARY_FLAG");
    cVar10 = cmMakefile::GetDefinition(pcVar8,&local_300.Name);
    std::__cxx11::string::~string((string *)&local_300);
    std::__cxx11::string::~string((string *)local_348);
    if (cVar10.Value == (string *)0x0) {
      pcVar8 = this->Makefile;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_300,"CMAKE_LINK_LIBRARY_FLAG",(allocator<char> *)local_348);
      cmMakefile::GetSafeDefinition(pcVar8,&local_300.Name);
      std::__cxx11::string::_M_assign(local_240);
      std::__cxx11::string::~string((string *)&local_300);
    }
    else {
      std::__cxx11::string::_M_assign(local_240);
    }
    pcVar8 = this->Makefile;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348,
                   "CMAKE_",__rhs);
    std::operator+(&local_300.Name,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348,
                   "_LINK_LIBRARY_FILE_FLAG");
    cVar10 = cmMakefile::GetDefinition(pcVar8,&local_300.Name);
    std::__cxx11::string::~string((string *)&local_300);
    std::__cxx11::string::~string((string *)local_348);
    if (cVar10.Value == (string *)0x0) {
      pcVar8 = this->Makefile;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_300,"CMAKE_LINK_LIBRARY_FILE_FLAG",(allocator<char> *)local_348);
      cmMakefile::GetSafeDefinition(pcVar8,&local_300.Name);
      std::__cxx11::string::_M_assign(local_248);
      std::__cxx11::string::~string((string *)&local_300);
    }
    else {
      std::__cxx11::string::_M_assign(local_248);
    }
    pcVar8 = this->Makefile;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348,
                   "CMAKE_",__rhs);
    std::operator+(&local_300.Name,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348,
                   "_LINK_LIBRARY_SUFFIX");
    cVar10 = cmMakefile::GetDefinition(pcVar8,&local_300.Name);
    std::__cxx11::string::~string((string *)&local_300);
    std::__cxx11::string::~string((string *)local_348);
    if (cVar10.Value == (string *)0x0) {
      pcVar8 = this->Makefile;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_300,"CMAKE_LINK_LIBRARY_SUFFIX",(allocator<char> *)local_348);
      cmMakefile::GetSafeDefinition(pcVar8,&local_300.Name);
      std::__cxx11::string::_M_assign(local_250);
      std::__cxx11::string::~string((string *)&local_300);
    }
    else {
      std::__cxx11::string::_M_assign(local_250);
    }
    pcVar8 = this->Makefile;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348,
                   "CMAKE_",__rhs);
    std::operator+(&local_300.Name,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348,
                   "_LINK_OBJECT_FILE_FLAG");
    cVar10 = cmMakefile::GetDefinition(pcVar8,&local_300.Name);
    std::__cxx11::string::~string((string *)&local_300);
    std::__cxx11::string::~string((string *)local_348);
    if (cVar10.Value == (string *)0x0) {
      pcVar8 = this->Makefile;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_300,"CMAKE_LINK_OBJECT_FILE_FLAG",(allocator<char> *)local_348);
      cmMakefile::GetSafeDefinition(pcVar8,&local_300.Name);
      std::__cxx11::string::_M_assign(local_258);
      std::__cxx11::string::~string((string *)&local_300);
    }
    else {
      std::__cxx11::string::_M_assign(local_258);
    }
    this->RuntimeUseChrpath = false;
    TVar6 = cmGeneratorTarget::GetType(this->Target);
    if (TVar6 != STATIC_LIBRARY) {
      TVar6 = cmGeneratorTarget::GetType(this->Target);
      pbVar12 = (pointer)0x5c6fa5;
      if (TVar6 == EXECUTABLE) {
        pbVar12 = (pointer)0x59455f;
      }
      local_300.Name._M_dataplus._M_p = &DAT_00000006;
      local_300.Name._M_string_length = 0x59039e;
      pcVar2 = (pointer)((ulong)(TVar6 != EXECUTABLE) * 4 + 10);
      local_348._0_8_ = pcVar2;
      local_348._8_8_ = pbVar12;
      cmStrCat<char[10],std::__cxx11::string,char[6]>
                ((string *)local_1f0,(cmAlphaNum *)&local_300,(cmAlphaNum *)local_348,
                 (char (*) [10])0x5c680c,__rhs,(char (*) [6])0x5b1ac1);
      std::operator+(&local_170,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f0,
                     "_SEP");
      cmMakefile::GetSafeDefinition(this->Makefile,(string *)local_1f0);
      std::__cxx11::string::_M_assign(local_210);
      cmMakefile::GetSafeDefinition(this->Makefile,&local_170);
      std::__cxx11::string::_M_assign(local_218);
      pcVar8 = this->Makefile;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_300,"CMAKE_PLATFORM_REQUIRED_RUNTIME_PATH",
                 (allocator<char> *)local_348);
      cmMakefile::GetSafeDefinition(pcVar8,&local_300.Name);
      std::__cxx11::string::_M_assign(local_220);
      std::__cxx11::string::~string((string *)&local_300);
      bVar5 = cmGeneratorTarget::IsChrpathUsed(this->Target,config);
      this->RuntimeUseChrpath = bVar5;
      local_300.Name._M_dataplus._M_p = &DAT_00000006;
      local_300.Name._M_string_length = 0x59039e;
      local_348._0_8_ = pcVar2;
      local_348._8_8_ = pbVar12;
      cmStrCat<char[13],std::__cxx11::string,char[6]>
                (&local_50,(cmAlphaNum *)&local_300,(cmAlphaNum *)local_348,
                 (char (*) [13])"_RPATH_LINK_",__rhs,(char (*) [6])0x5b1ac1);
      cmMakefile::GetSafeDefinition(this->Makefile,&local_50);
      std::__cxx11::string::_M_assign(local_228);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)local_1f0);
    }
    local_300.Name._M_dataplus._M_p = &DAT_0000001a;
    local_300.Name._M_string_length = 0x586719;
    local_348._8_8_ = (this->LinkLanguage)._M_dataplus._M_p;
    local_348._0_8_ = (this->LinkLanguage)._M_string_length;
    cmStrCat<char[19]>((string *)local_1f0,(cmAlphaNum *)&local_300,(cmAlphaNum *)local_348,
                       (char (*) [19])"_WITH_RUNTIME_PATH");
    this_03 = local_1f8;
    bVar5 = cmMakefile::IsOn(this->Makefile,(string *)local_1f0);
    this->LinkWithRuntimePath = bVar5;
    std::__cxx11::string::~string((string *)local_1f0);
    if ((this->LibLinkFileFlag)._M_string_length != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,"__CMAKE_LINK_LIBRARY",(allocator<char> *)&local_170);
      local_348._8_8_ = (this->LibLinkFileFlag)._M_dataplus._M_p;
      local_348._0_8_ = (this->LibLinkFileFlag)._M_string_length;
      local_1f0[0].View_._M_len = (size_t)&DAT_00000009;
      local_1f0[0].View_._M_str = "<LIBRARY>";
      cmStrCat<>(&local_90,(cmAlphaNum *)local_348,local_1f0);
      LibraryFeatureDescriptor::LibraryFeatureDescriptor
                ((LibraryFeatureDescriptor *)&local_300,&local_70,&local_90);
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
      ::_M_emplace_unique<char_const(&)[21],cmComputeLinkInformation::LibraryFeatureDescriptor>
                (this_03,(char (*) [21])"__CMAKE_LINK_LIBRARY",
                 (LibraryFeatureDescriptor *)&local_300);
      FeatureDescriptor::~FeatureDescriptor(&local_300);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_70);
    }
    if ((this->ObjLinkFileFlag)._M_string_length != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b0,"__CMAKE_LINK_OBJECT",(allocator<char> *)&local_170);
      local_348._8_8_ = (this->ObjLinkFileFlag)._M_dataplus._M_p;
      local_348._0_8_ = (this->ObjLinkFileFlag)._M_string_length;
      local_1f0[0].View_._M_len = (size_t)&DAT_00000009;
      local_1f0[0].View_._M_str = "<LIBRARY>";
      cmStrCat<>(&local_d0,(cmAlphaNum *)local_348,local_1f0);
      LibraryFeatureDescriptor::LibraryFeatureDescriptor
                ((LibraryFeatureDescriptor *)&local_300,&local_b0,&local_d0);
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
      ::_M_emplace_unique<char_const(&)[20],cmComputeLinkInformation::LibraryFeatureDescriptor>
                (this_03,(char (*) [20])"__CMAKE_LINK_OBJECT",(LibraryFeatureDescriptor *)&local_300
                );
      FeatureDescriptor::~FeatureDescriptor(&local_300);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_b0);
    }
    psVar11 = (this->LoaderFlag).Value;
    if (psVar11 == (string *)0x0) {
      psVar11 = &cmValue::Empty_abi_cxx11_;
    }
    if (psVar11->_M_string_length != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f0,"__CMAKE_LINK_EXECUTABLE",(allocator<char> *)&local_170);
      psVar11 = (this->LoaderFlag).Value;
      if (psVar11 == (string *)0x0) {
        psVar11 = &cmValue::Empty_abi_cxx11_;
      }
      local_348._8_8_ = (psVar11->_M_dataplus)._M_p;
      local_348._0_8_ = psVar11->_M_string_length;
      local_1f0[0].View_._M_len = (size_t)&DAT_00000009;
      local_1f0[0].View_._M_str = "<LIBRARY>";
      cmStrCat<>(&local_110,(cmAlphaNum *)local_348,local_1f0);
      LibraryFeatureDescriptor::LibraryFeatureDescriptor
                ((LibraryFeatureDescriptor *)&local_300,&local_f0,&local_110);
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
      ::_M_emplace_unique<char_const(&)[24],cmComputeLinkInformation::LibraryFeatureDescriptor>
                (this_03,(char (*) [24])"__CMAKE_LINK_EXECUTABLE",
                 (LibraryFeatureDescriptor *)&local_300);
      FeatureDescriptor::~FeatureDescriptor(&local_300);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_f0);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_130,"__CMAKE_LINK_FRAMEWORK",(allocator<char> *)local_348);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_150,"<LIBRARY>",(allocator<char> *)local_1f0);
    LibraryFeatureDescriptor::LibraryFeatureDescriptor
              ((LibraryFeatureDescriptor *)&local_300,&local_130,&local_150);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
    ::_M_emplace_unique<char_const(&)[23],cmComputeLinkInformation::LibraryFeatureDescriptor>
              (this_03,(char (*) [23])"__CMAKE_LINK_FRAMEWORK",
               (LibraryFeatureDescriptor *)&local_300);
    FeatureDescriptor::~FeatureDescriptor(&local_300);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_130);
    pcVar8 = this->Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_300,"CMAKE_PLATFORM_USES_PATH_WHEN_NO_SONAME",
               (allocator<char> *)local_348);
    bVar5 = cmMakefile::IsOn(pcVar8,&local_300.Name);
    this->NoSONameUsesPath = bVar5;
    std::__cxx11::string::~string((string *)&local_300);
    ComputeLinkTypeInfo(this);
    ComputeItemParserInfo(this);
    ComputeFrameworkInfo(this);
    this->SharedDependencyMode = SharedDepModeNone;
    pcVar8 = this->Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_300,"CMAKE_LINK_DEPENDENT_LIBRARY_FILES",
               (allocator<char> *)local_348);
    bVar5 = cmMakefile::IsOn(pcVar8,&local_300.Name);
    std::__cxx11::string::~string((string *)&local_300);
    if (bVar5) {
      this->SharedDependencyMode = SharedDepModeLink;
    }
    else {
      pcVar8 = this->Makefile;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_300,"CMAKE_LINK_DEPENDENT_LIBRARY_DIRS",
                 (allocator<char> *)local_348);
      bVar5 = cmMakefile::IsOn(pcVar8,&local_300.Name);
      std::__cxx11::string::~string((string *)&local_300);
      if (bVar5) {
        this->SharedDependencyMode = SharedDepModeLibDir;
      }
      else if ((this->RPathLinkFlag)._M_string_length != 0) {
        this->SharedDependencyMode = SharedDepModeDir;
        std::
        make_unique<cmOrderDirectories,cmGlobalGenerator*const&,cmGeneratorTarget_const*&,char_const(&)[23]>
                  ((cmGlobalGenerator **)&local_300,(cmGeneratorTarget **)__args_1,
                   (char (*) [23])&local_238);
        _Var4._M_p = local_300.Name._M_dataplus._M_p;
        local_300.Name._M_dataplus._M_p = (pointer)0x0;
        std::__uniq_ptr_impl<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_>::reset
                  ((__uniq_ptr_impl<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_> *)
                   local_310,(pointer)_Var4._M_p);
        std::unique_ptr<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_>::~unique_ptr
                  ((unique_ptr<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_> *)
                   &local_300);
      }
    }
    implicitDirs = local_200;
    local_348._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_348._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_348._16_8_ = 0;
    cmGeneratorTarget::GetLinkDirectories
              (this->Target,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_348,config,__rhs);
    cmOrderDirectories::AddUserDirectories
              ((this_00->_M_t).
               super___uniq_ptr_impl<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmOrderDirectories_*,_std::default_delete<cmOrderDirectories>_>
               .super__Head_base<0UL,_cmOrderDirectories_*,_false>._M_head_impl,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_348);
    cmOrderDirectories::AddUserDirectories
              ((local_308->_M_t).
               super___uniq_ptr_impl<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmOrderDirectories_*,_std::default_delete<cmOrderDirectories>_>
               .super__Head_base<0UL,_cmOrderDirectories_*,_false>._M_head_impl,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_348);
    LoadImplicitLinkInfo(this);
    cmOrderDirectories::SetImplicitDirectories
              ((this_00->_M_t).
               super___uniq_ptr_impl<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmOrderDirectories_*,_std::default_delete<cmOrderDirectories>_>
               .super__Head_base<0UL,_cmOrderDirectories_*,_false>._M_head_impl,implicitDirs);
    cmOrderDirectories::SetImplicitDirectories
              ((local_308->_M_t).
               super___uniq_ptr_impl<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmOrderDirectories_*,_std::default_delete<cmOrderDirectories>_>
               .super__Head_base<0UL,_cmOrderDirectories_*,_false>._M_head_impl,implicitDirs);
    this_02 = (local_310->_M_t).
              super___uniq_ptr_impl<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_>.
              _M_t.
              super__Tuple_impl<0UL,_cmOrderDirectories_*,_std::default_delete<cmOrderDirectories>_>
              .super__Head_base<0UL,_cmOrderDirectories_*,_false>._M_head_impl;
    if (this_02 != (cmOrderDirectories *)0x0) {
      cmOrderDirectories::SetImplicitDirectories(this_02,implicitDirs);
      cmOrderDirectories::AddLanguageDirectories
                ((local_310->_M_t).
                 super___uniq_ptr_impl<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmOrderDirectories_*,_std::default_delete<cmOrderDirectories>_>
                 .super__Head_base<0UL,_cmOrderDirectories_*,_false>._M_head_impl,local_208);
    }
    PVar7 = cmGeneratorTarget::GetPolicyStatusCMP0003(this->Target);
    this->OldLinkDirMode = PVar7 != NEW;
    if (PVar7 != NEW) {
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::
      _M_insert_range_unique<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                (local_230,
                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )local_348._0_8_,
                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )local_348._8_8_);
    }
    pcVar8 = this->Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_300,"CMAKE_POLICY_WARNING_CMP0060",(allocator<char> *)local_1f0);
    bVar5 = cmMakefile::PolicyOptionalWarningEnabled(pcVar8,&local_300.Name);
    this->CMP0060Warn = bVar5;
    std::__cxx11::string::~string((string *)&local_300);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_348);
  }
  return;
}

Assistant:

cmComputeLinkInformation::cmComputeLinkInformation(
  const cmGeneratorTarget* target, const std::string& config)
  // Store context information.
  : Target(target)
  , Makefile(target->Target->GetMakefile())
  , GlobalGenerator(target->GetLocalGenerator()->GetGlobalGenerator())
  , CMakeInstance(this->GlobalGenerator->GetCMakeInstance())
  // The configuration being linked.
  , Config(config)
{
  // Check whether to recognize OpenBSD-style library versioned names.
  this->OpenBSD = this->Makefile->GetState()->GetGlobalPropertyAsBool(
    "FIND_LIBRARY_USE_OPENBSD_VERSIONING");

  // Allocate internals.
  this->OrderLinkerSearchPath = cm::make_unique<cmOrderDirectories>(
    this->GlobalGenerator, target, "linker search path");
  this->OrderRuntimeSearchPath = cm::make_unique<cmOrderDirectories>(
    this->GlobalGenerator, target, "runtime search path");

  // Get the language used for linking this target.
  this->LinkLanguage = this->Target->GetLinkerLanguage(config);
  if (this->LinkLanguage.empty()) {
    // The Compute method will do nothing, so skip the rest of the
    // initialization.
    return;
  }

  // Check whether we should skip dependencies on shared library files.
  this->LinkDependsNoShared =
    this->Target->GetPropertyAsBool("LINK_DEPENDS_NO_SHARED");

  // On platforms without import libraries there may be a special flag
  // to use when creating a plugin (module) that obtains symbols from
  // the program that will load it.
  if (!this->Target->IsDLLPlatform() &&
      this->Target->GetType() == cmStateEnums::MODULE_LIBRARY) {
    std::string loader_flag_var =
      cmStrCat("CMAKE_SHARED_MODULE_LOADER_", this->LinkLanguage, "_FLAG");
    this->LoaderFlag = this->Makefile->GetDefinition(loader_flag_var);
  }

  // Get options needed to link libraries.
  if (cmValue flag = this->Makefile->GetDefinition(
        "CMAKE_" + this->LinkLanguage + "_LINK_LIBRARY_FLAG")) {
    this->LibLinkFlag = *flag;
  } else {
    this->LibLinkFlag =
      this->Makefile->GetSafeDefinition("CMAKE_LINK_LIBRARY_FLAG");
  }
  if (cmValue flag = this->Makefile->GetDefinition(
        "CMAKE_" + this->LinkLanguage + "_LINK_LIBRARY_FILE_FLAG")) {
    this->LibLinkFileFlag = *flag;
  } else {
    this->LibLinkFileFlag =
      this->Makefile->GetSafeDefinition("CMAKE_LINK_LIBRARY_FILE_FLAG");
  }
  if (cmValue suffix = this->Makefile->GetDefinition(
        "CMAKE_" + this->LinkLanguage + "_LINK_LIBRARY_SUFFIX")) {
    this->LibLinkSuffix = *suffix;
  } else {
    this->LibLinkSuffix =
      this->Makefile->GetSafeDefinition("CMAKE_LINK_LIBRARY_SUFFIX");
  }
  if (cmValue flag = this->Makefile->GetDefinition(
        "CMAKE_" + this->LinkLanguage + "_LINK_OBJECT_FILE_FLAG")) {
    this->ObjLinkFileFlag = *flag;
  } else {
    this->ObjLinkFileFlag =
      this->Makefile->GetSafeDefinition("CMAKE_LINK_OBJECT_FILE_FLAG");
  }

  // Get options needed to specify RPATHs.
  this->RuntimeUseChrpath = false;
  if (this->Target->GetType() != cmStateEnums::STATIC_LIBRARY) {
    const char* tType = ((this->Target->GetType() == cmStateEnums::EXECUTABLE)
                           ? "EXECUTABLE"
                           : "SHARED_LIBRARY");
    std::string rtVar =
      cmStrCat("CMAKE_", tType, "_RUNTIME_", this->LinkLanguage, "_FLAG");
    std::string rtSepVar = rtVar + "_SEP";
    this->RuntimeFlag = this->Makefile->GetSafeDefinition(rtVar);
    this->RuntimeSep = this->Makefile->GetSafeDefinition(rtSepVar);
    this->RuntimeAlways = (this->Makefile->GetSafeDefinition(
      "CMAKE_PLATFORM_REQUIRED_RUNTIME_PATH"));

    this->RuntimeUseChrpath = this->Target->IsChrpathUsed(config);

    // Get options needed to help find dependent libraries.
    std::string rlVar =
      cmStrCat("CMAKE_", tType, "_RPATH_LINK_", this->LinkLanguage, "_FLAG");
    this->RPathLinkFlag = this->Makefile->GetSafeDefinition(rlVar);
  }

  // Check if we need to include the runtime search path at link time.
  {
    std::string var = cmStrCat("CMAKE_SHARED_LIBRARY_LINK_",
                               this->LinkLanguage, "_WITH_RUNTIME_PATH");
    this->LinkWithRuntimePath = this->Makefile->IsOn(var);
  }

  // Define some Feature descriptors to handle standard library and object link
  if (!this->GetLibLinkFileFlag().empty()) {
    this->LibraryFeatureDescriptors.emplace(
      "__CMAKE_LINK_LIBRARY",
      LibraryFeatureDescriptor{
        "__CMAKE_LINK_LIBRARY",
        cmStrCat(this->GetLibLinkFileFlag(), "<LIBRARY>") });
  }
  if (!this->GetObjLinkFileFlag().empty()) {
    this->LibraryFeatureDescriptors.emplace(
      "__CMAKE_LINK_OBJECT",
      LibraryFeatureDescriptor{
        "__CMAKE_LINK_OBJECT",
        cmStrCat(this->GetObjLinkFileFlag(), "<LIBRARY>") });
  }
  if (!this->LoaderFlag->empty()) {
    // Define a Feature descriptor for the link of an executable with exports
    this->LibraryFeatureDescriptors.emplace(
      "__CMAKE_LINK_EXECUTABLE",
      LibraryFeatureDescriptor{ "__CMAKE_LINK_EXECUTABLE",
                                cmStrCat(this->LoaderFlag, "<LIBRARY>") });
  }
  // To link framewortk using a full path
  this->LibraryFeatureDescriptors.emplace(
    "__CMAKE_LINK_FRAMEWORK",
    LibraryFeatureDescriptor{ "__CMAKE_LINK_FRAMEWORK", "<LIBRARY>" });

  // Check the platform policy for missing soname case.
  this->NoSONameUsesPath =
    this->Makefile->IsOn("CMAKE_PLATFORM_USES_PATH_WHEN_NO_SONAME");

  // Get link type information.
  this->ComputeLinkTypeInfo();

  // Setup the link item parser.
  this->ComputeItemParserInfo();

  // Setup framework support.
  this->ComputeFrameworkInfo();

  // Choose a mode for dealing with shared library dependencies.
  this->SharedDependencyMode = SharedDepModeNone;
  if (this->Makefile->IsOn("CMAKE_LINK_DEPENDENT_LIBRARY_FILES")) {
    this->SharedDependencyMode = SharedDepModeLink;
  } else if (this->Makefile->IsOn("CMAKE_LINK_DEPENDENT_LIBRARY_DIRS")) {
    this->SharedDependencyMode = SharedDepModeLibDir;
  } else if (!this->RPathLinkFlag.empty()) {
    this->SharedDependencyMode = SharedDepModeDir;
    this->OrderDependentRPath = cm::make_unique<cmOrderDirectories>(
      this->GlobalGenerator, target, "dependent library path");
  }

  // Add the search path entries requested by the user to path ordering.
  std::vector<std::string> directories;
  this->Target->GetLinkDirectories(directories, config, this->LinkLanguage);
  this->OrderLinkerSearchPath->AddUserDirectories(directories);
  this->OrderRuntimeSearchPath->AddUserDirectories(directories);

  // Set up the implicit link directories.
  this->LoadImplicitLinkInfo();
  this->OrderLinkerSearchPath->SetImplicitDirectories(this->ImplicitLinkDirs);
  this->OrderRuntimeSearchPath->SetImplicitDirectories(this->ImplicitLinkDirs);
  if (this->OrderDependentRPath) {
    this->OrderDependentRPath->SetImplicitDirectories(this->ImplicitLinkDirs);
    this->OrderDependentRPath->AddLanguageDirectories(this->RuntimeLinkDirs);
  }

  // Decide whether to enable compatible library search path mode.
  // There exists code that effectively does
  //
  //    /path/to/libA.so -lB
  //
  // where -lB is meant to link to /path/to/libB.so.  This is broken
  // because it specified -lB without specifying a link directory (-L)
  // in which to search for B.  This worked in CMake 2.4 and below
  // because -L/path/to would be added by the -L/-l split for A.  In
  // order to support such projects we need to add the directories
  // containing libraries linked with a full path to the -L path.
  this->OldLinkDirMode =
    this->Target->GetPolicyStatusCMP0003() != cmPolicies::NEW;
  if (this->OldLinkDirMode) {
    // Construct a mask to not bother with this behavior for link
    // directories already specified by the user.
    this->OldLinkDirMask.insert(directories.begin(), directories.end());
  }

  this->CMP0060Warn = this->Makefile->PolicyOptionalWarningEnabled(
    "CMAKE_POLICY_WARNING_CMP0060");
}